

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::parseTriple(char **token,int vsize,int vnsize,int vtsize,vertex_index_t *ret)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  int local_40;
  
  if (ret == (vertex_index_t *)0x0) {
    return false;
  }
  pcVar1 = *token;
  iVar2 = atoi(pcVar1);
  iVar5 = vsize + iVar2;
  if (iVar2 == 0) {
    iVar5 = -1;
  }
  if (0 < iVar2) {
    iVar5 = iVar2 + -1;
  }
  if (iVar2 == 0) {
    return false;
  }
  local_40 = -1;
  sVar4 = strcspn(pcVar1,"/ \t\r");
  pcVar6 = pcVar1 + sVar4;
  *token = pcVar6;
  iVar2 = -1;
  if (pcVar1[sVar4] == '/') {
    pcVar1 = pcVar6 + 1;
    *token = pcVar1;
    if (pcVar6[1] == '/') {
      pcVar6 = pcVar6 + 2;
      *token = pcVar6;
      iVar2 = atoi(pcVar6);
      if (iVar2 == 0) {
        return false;
      }
      local_40 = -1;
    }
    else {
      iVar3 = atoi(pcVar1);
      local_40 = vtsize + iVar3;
      iVar2 = -1;
      if (iVar3 == 0) {
        local_40 = -1;
      }
      if (0 < iVar3) {
        local_40 = iVar3 + -1;
      }
      if (iVar3 == 0) {
        return false;
      }
      sVar4 = strcspn(pcVar1,"/ \t\r");
      *token = pcVar1 + sVar4;
      if (pcVar1[sVar4] != '/') goto LAB_001518e8;
      pcVar6 = pcVar1 + sVar4 + 1;
      *token = pcVar6;
      iVar2 = atoi(pcVar6);
      if (iVar2 == 0) {
        return false;
      }
    }
    if (0 < iVar2) {
      vnsize = -1;
    }
    iVar2 = vnsize + iVar2;
    sVar4 = strcspn(pcVar6,"/ \t\r");
    *token = pcVar6 + sVar4;
  }
LAB_001518e8:
  ret->v_idx = iVar5;
  ret->vt_idx = local_40;
  ret->vn_idx = iVar2;
  return true;
}

Assistant:

static bool parseTriple(const char **token, int vsize, int vnsize, int vtsize,
                        vertex_index_t *ret) {
  if (!ret) {
    return false;
  }

  vertex_index_t vi(-1);

  if (!fixIndex(atoi((*token)), vsize, &(vi.v_idx))) {
    return false;
  }

  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    (*ret) = vi;
    return true;
  }
  (*token)++;

  // i//k
  if ((*token)[0] == '/') {
    (*token)++;
    if (!fixIndex(atoi((*token)), vnsize, &(vi.vn_idx))) {
      return false;
    }
    (*token) += strcspn((*token), "/ \t\r");
    (*ret) = vi;
    return true;
  }

  // i/j/k or i/j
  if (!fixIndex(atoi((*token)), vtsize, &(vi.vt_idx))) {
    return false;
  }

  (*token) += strcspn((*token), "/ \t\r");
  if ((*token)[0] != '/') {
    (*ret) = vi;
    return true;
  }

  // i/j/k
  (*token)++;  // skip '/'
  if (!fixIndex(atoi((*token)), vnsize, &(vi.vn_idx))) {
    return false;
  }
  (*token) += strcspn((*token), "/ \t\r");

  (*ret) = vi;

  return true;
}